

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

token_t new_id_token(c2m_ctx_t c2m_ctx,pos_t pos,char *id_str)

{
  token_t ptVar1;
  node_t_conflict n;
  str_t sVar2;
  
  sVar2 = uniq_cstr(c2m_ctx,id_str);
  ptVar1 = (token_t)reg_malloc(c2m_ctx,0x30);
  *(undefined4 *)ptVar1 = 0x103;
  (ptVar1->pos).fname = pos.fname;
  (ptVar1->pos).lno = (int)pos._8_8_;
  (ptVar1->pos).ln_pos = (int)((ulong)pos._8_8_ >> 0x20);
  ptVar1->repr = sVar2.s;
  ptVar1->node_code = N_IGNORE;
  ptVar1->node = (node_t_conflict)0x0;
  n = new_node(c2m_ctx,N_ID);
  add_pos(c2m_ctx,n,pos);
  (n->u).s = sVar2;
  ptVar1->node = n;
  return ptVar1;
}

Assistant:

static token_t new_id_token (c2m_ctx_t c2m_ctx, pos_t pos, const char *id_str) {
  token_t token;
  str_t str = uniq_cstr (c2m_ctx, id_str);

  token = new_token (c2m_ctx, pos, str.s, T_ID, N_IGNORE);
  token->node = new_str_node (c2m_ctx, N_ID, str, pos);
  return token;
}